

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fOpaqueTypeIndexingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockArrayIndexingCase::iterate
          (BlockArrayIndexingCase *this)

{
  allocator<unsigned_int> *paVar1;
  int numInstances_00;
  glBindBufferFunc p_Var2;
  glBufferDataFunc p_Var3;
  glBindBufferBaseFunc p_Var4;
  undefined4 uVar5;
  bool bVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  int iVar10;
  uint uVar11;
  GLuint GVar12;
  GLenum err;
  qpTestResult qVar13;
  reference pvVar14;
  reference pvVar15;
  RenderContext *pRVar16;
  Functions *gl_00;
  ShaderExecutor *pSVar17;
  TestLog *pTVar18;
  TestError *this_00;
  size_type sVar19;
  reference __value;
  reference ppvVar20;
  MessageBuilder *pMVar21;
  reference local_470;
  Hex<8UL> local_398;
  Hex<8UL> local_390;
  MessageBuilder local_388;
  value_type local_208;
  value_type local_204;
  deUint32 resValue;
  deUint32 refValue;
  int readNdx_4;
  int invocationNdx;
  int local_1ec;
  reference pvStack_1e8;
  int readNdx_3;
  int local_1dc;
  reference pvStack_1d8;
  int readNdx_2;
  int *dst;
  int readNdx_1;
  int instanceNdx_1;
  vector<void_*,_std::allocator<void_*>_> outputs;
  vector<void_*,_std::allocator<void_*>_> inputs;
  vector<int,_std::allocator<int>_> expandedIndices;
  undefined1 local_178 [8];
  ShaderExecutorPtr shaderExecutor;
  undefined1 local_160 [4];
  deUint32 bufTarget;
  BufferVector buffers;
  int baseBinding;
  Functions *gl;
  RenderContext *renderCtx;
  int instanceNdx;
  int readNdx;
  Random rnd;
  ShaderSpec shaderSpec;
  undefined1 local_88 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> outValues;
  undefined1 local_68 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> inValues;
  allocator<int> local_39;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> readIndices;
  int numReads;
  int numInstances;
  int numInvocations;
  BlockArrayIndexingCase *this_local;
  undefined4 extraout_var;
  
  numInstances_00 = this->m_numInstances;
  readIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 4;
  std::allocator<int>::allocator(&local_39);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_38,4,&local_39);
  std::allocator<int>::~allocator(&local_39);
  paVar1 = (allocator<unsigned_int> *)
           ((long)&outValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(paVar1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,(long)numInstances_00,
             paVar1);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&outValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  paVar1 = (allocator<unsigned_int> *)(shaderSpec.source.field_2._M_local_buf + 0xf);
  std::allocator<unsigned_int>::allocator(paVar1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,0x80,paVar1);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)(shaderSpec.source.field_2._M_local_buf + 0xf));
  gls::ShaderExecUtil::ShaderSpec::ShaderSpec((ShaderSpec *)&rnd.m_rnd.z);
  dVar7 = deInt32Hash(this->m_shaderType);
  dVar8 = deInt32Hash(this->m_blockType);
  dVar9 = deInt32Hash(this->m_indexExprType);
  de::Random::Random((Random *)&instanceNdx,dVar7 ^ dVar8 ^ dVar9);
  for (renderCtx._4_4_ = 0; renderCtx._4_4_ < 4; renderCtx._4_4_ = renderCtx._4_4_ + 1) {
    iVar10 = de::Random::getInt((Random *)&instanceNdx,0,numInstances_00 + -1);
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_38,(long)renderCtx._4_4_);
    *pvVar14 = iVar10;
  }
  for (renderCtx._0_4_ = 0; (int)renderCtx < numInstances_00; renderCtx._0_4_ = (int)renderCtx + 1)
  {
    dVar7 = de::Random::getUint32((Random *)&instanceNdx);
    pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,
                         (long)(int)renderCtx);
    *pvVar15 = dVar7;
  }
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)local_38,0);
  pRVar16 = Context::getRenderContext((this->super_TestCase).m_context);
  getShaderSpec(this,(ShaderSpec *)&rnd.m_rnd.z,numInstances_00,4,pvVar14,pRVar16);
  pRVar16 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar10 = (*pRVar16->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar10);
  buffers.super_ObjectVector.m_objects.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 2;
  glu::TypedObjectVector<(glu::ObjectType)1>::TypedObjectVector
            ((TypedObjectVector<(glu::ObjectType)1> *)local_160,pRVar16,(long)numInstances_00);
  shaderExecutor.
  super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  .m_data._12_4_ = 0x8a11;
  if (this->m_blockType == BLOCKTYPE_BUFFER) {
    shaderExecutor.
    super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
    .m_data._12_4_ = 0x90d2;
  }
  pSVar17 = gls::ShaderExecUtil::createExecutor
                      (pRVar16,this->m_shaderType,(ShaderSpec *)&rnd.m_rnd.z);
  de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>::DefaultDeleter
            ((DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor> *)
             ((long)&expandedIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  de::details::
  UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  ::UniquePtr((UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
               *)local_178,pSVar17);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)
             &outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)&readNdx_1);
  pTVar18 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  pSVar17 = de::details::
            UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
            ::operator*((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                         *)local_178);
  gls::ShaderExecUtil::operator<<(pTVar18,pSVar17);
  pSVar17 = de::details::
            UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
            ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                          *)local_178);
  uVar11 = (*pSVar17->_vptr_ShaderExecutor[2])();
  if ((uVar11 & 1) != 0) {
    pSVar17 = de::details::
              UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
              ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                            *)local_178);
    (*pSVar17->_vptr_ShaderExecutor[5])();
    for (dst._4_4_ = 0;
        uVar5 = shaderExecutor.
                super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                .m_data._12_4_, dst._4_4_ < numInstances_00; dst._4_4_ = dst._4_4_ + 1) {
      p_Var2 = gl_00->bindBuffer;
      dVar7 = glu::ObjectVector::operator[]((ObjectVector *)local_160,(long)dst._4_4_);
      (*p_Var2)(uVar5,dVar7);
      uVar5 = shaderExecutor.
              super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
              .m_data._12_4_;
      p_Var3 = gl_00->bufferData;
      pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,
                           (long)dst._4_4_);
      (*p_Var3)(uVar5,4,pvVar15,0x88e4);
      uVar5 = shaderExecutor.
              super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
              .m_data._12_4_;
      p_Var4 = gl_00->bindBufferBase;
      GVar12 = dst._4_4_ + 2;
      dVar7 = glu::ObjectVector::operator[]((ObjectVector *)local_160,(long)dst._4_4_);
      (*p_Var4)(uVar5,GVar12,dVar7);
    }
    if (this->m_indexExprType == INDEX_EXPR_TYPE_DYNAMIC_UNIFORM) {
      sVar19 = std::vector<int,_std::allocator<int>_>::size
                         ((vector<int,_std::allocator<int>_> *)local_38);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 &inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,sVar19 << 5);
      for (dst._0_4_ = 0; (int)dst < 4; dst._0_4_ = (int)dst + 1) {
        pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)
                             &inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,(long)((int)dst << 5));
        pvStack_1d8 = pvVar14;
        __value = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_38,(long)(int)dst);
        std::fill<int*,int>(pvVar14,pvVar14 + 0x20,__value);
      }
      for (local_1dc = 0; local_1dc < 4; local_1dc = local_1dc + 1) {
        pvStack_1e8 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 &inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage,(long)(local_1dc << 5))
        ;
        std::vector<void_*,_std::allocator<void_*>_>::push_back
                  ((vector<void_*,_std::allocator<void_*>_> *)
                   &outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&stack0xfffffffffffffe18);
      }
    }
    else if (this->m_indexExprType == INDEX_EXPR_TYPE_UNIFORM) {
      pSVar17 = de::details::
                UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                              *)local_178);
      dVar7 = (*pSVar17->_vptr_ShaderExecutor[4])();
      pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_38,0);
      uploadUniformIndices(gl_00,dVar7,"index",4,pvVar14);
    }
    for (local_1ec = 0; local_1ec < 4; local_1ec = local_1ec + 1) {
      _readNdx_4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,
                              (long)(local_1ec << 5));
      std::vector<void_*,_std::allocator<void_*>_>::push_back
                ((vector<void_*,_std::allocator<void_*>_> *)&readNdx_1,(value_type *)&readNdx_4);
    }
    err = (*gl_00->getError)();
    glu::checkError(err,"Setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fOpaqueTypeIndexingTests.cpp"
                    ,0x388);
    pSVar17 = de::details::
              UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
              ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                            *)local_178);
    bVar6 = std::vector<void_*,_std::allocator<void_*>_>::empty
                      ((vector<void_*,_std::allocator<void_*>_> *)
                       &outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (bVar6) {
      local_470 = (reference)0x0;
    }
    else {
      local_470 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                            ((vector<void_*,_std::allocator<void_*>_> *)
                             &outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,0);
    }
    ppvVar20 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                         ((vector<void_*,_std::allocator<void_*>_> *)&readNdx_1,0);
    (*pSVar17->_vptr_ShaderExecutor[6])(pSVar17,0x20,local_470,ppvVar20);
    std::vector<void_*,_std::allocator<void_*>_>::~vector
              ((vector<void_*,_std::allocator<void_*>_> *)&readNdx_1);
    std::vector<void_*,_std::allocator<void_*>_>::~vector
              ((vector<void_*,_std::allocator<void_*>_> *)
               &outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    de::details::
    UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
    ::~UniquePtr((UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                  *)local_178);
    glu::TypedObjectVector<(glu::ObjectType)1>::~TypedObjectVector
              ((TypedObjectVector<(glu::ObjectType)1> *)local_160);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    for (refValue = 0; (int)refValue < 0x20; refValue = refValue + 1) {
      for (resValue = 0; (int)resValue < 4; resValue = resValue + 1) {
        pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_38,(long)(int)resValue);
        pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,
                             (long)*pvVar14);
        local_204 = *pvVar15;
        pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,
                             (long)(int)(resValue * 0x20 + refValue));
        local_208 = *pvVar15;
        if (local_204 != local_208) {
          pTVar18 = tcu::TestContext::getLog
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_388,pTVar18,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar21 = tcu::MessageBuilder::operator<<
                              (&local_388,(char (*) [22])"ERROR: at invocation ");
          pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,(int *)&refValue);
          pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,(char (*) [8])", read ");
          pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,(int *)&resValue);
          pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,(char (*) [12])0xf1e493);
          local_390 = tcu::toHex<unsigned_int>(local_204);
          pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,&local_390);
          pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,(char (*) [7])0xf925e6);
          local_398 = tcu::toHex<unsigned_int>(local_208);
          pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,&local_398);
          tcu::MessageBuilder::operator<<(pMVar21,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_388);
          qVar13 = tcu::TestContext::getTestResult
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          if (qVar13 == QP_TEST_RESULT_PASS) {
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Invalid result value");
          }
        }
      }
    }
    de::Random::~Random((Random *)&instanceNdx);
    gls::ShaderExecUtil::ShaderSpec::~ShaderSpec((ShaderSpec *)&rnd.m_rnd.z);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fOpaqueTypeIndexingTests.cpp"
             ,0x36a);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

BlockArrayIndexingCase::IterateResult BlockArrayIndexingCase::iterate (void)
{
	const int			numInvocations		= 32;
	const int			numInstances		= m_numInstances;
	const int			numReads			= 4;
	vector<int>			readIndices			(numReads);
	vector<deUint32>	inValues			(numInstances);
	vector<deUint32>	outValues			(numInvocations*numReads);
	ShaderSpec			shaderSpec;
	de::Random			rnd					(deInt32Hash(m_shaderType) ^ deInt32Hash(m_blockType) ^ deInt32Hash(m_indexExprType));

	for (int readNdx = 0; readNdx < numReads; readNdx++)
		readIndices[readNdx] = rnd.getInt(0, numInstances-1);

	for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		inValues[instanceNdx] = rnd.getUint32();

	getShaderSpec(&shaderSpec, numInstances, numReads, &readIndices[0], m_context.getRenderContext());

	{
		const RenderContext&	renderCtx		= m_context.getRenderContext();
		const glw::Functions&	gl				= renderCtx.getFunctions();
		const int				baseBinding		= 2;
		const BufferVector		buffers			(renderCtx, numInstances);
		const deUint32			bufTarget		= m_blockType == BLOCKTYPE_BUFFER ? GL_SHADER_STORAGE_BUFFER : GL_UNIFORM_BUFFER;
		ShaderExecutorPtr		shaderExecutor	(createExecutor(renderCtx, m_shaderType, shaderSpec));
		vector<int>				expandedIndices;
		vector<void*>			inputs;
		vector<void*>			outputs;

		m_testCtx.getLog() << *shaderExecutor;

		if (!shaderExecutor->isOk())
			TCU_FAIL("Compile failed");

		shaderExecutor->useProgram();

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			gl.bindBuffer(bufTarget, buffers[instanceNdx]);
			gl.bufferData(bufTarget, (glw::GLsizeiptr)sizeof(deUint32), &inValues[instanceNdx], GL_STATIC_DRAW);
			gl.bindBufferBase(bufTarget, baseBinding+instanceNdx, buffers[instanceNdx]);
		}

		if (m_indexExprType == INDEX_EXPR_TYPE_DYNAMIC_UNIFORM)
		{
			expandedIndices.resize(numInvocations * readIndices.size());

			for (int readNdx = 0; readNdx < numReads; readNdx++)
			{
				int* dst = &expandedIndices[numInvocations*readNdx];
				std::fill(dst, dst+numInvocations, readIndices[readNdx]);
			}

			for (int readNdx = 0; readNdx < numReads; readNdx++)
				inputs.push_back(&expandedIndices[readNdx*numInvocations]);
		}
		else if (m_indexExprType == INDEX_EXPR_TYPE_UNIFORM)
			uploadUniformIndices(gl, shaderExecutor->getProgram(), "index", numReads, &readIndices[0]);

		for (int readNdx = 0; readNdx < numReads; readNdx++)
			outputs.push_back(&outValues[readNdx*numInvocations]);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Setup failed");

		shaderExecutor->execute(numInvocations, inputs.empty() ? DE_NULL : &inputs[0], &outputs[0]);
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	for (int invocationNdx = 0; invocationNdx < numInvocations; invocationNdx++)
	{
		for (int readNdx = 0; readNdx < numReads; readNdx++)
		{
			const deUint32	refValue	= inValues[readIndices[readNdx]];
			const deUint32	resValue	= outValues[readNdx*numInvocations + invocationNdx];

			if (refValue != resValue)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at invocation " << invocationNdx
													   << ", read " << readNdx << ": expected "
													   << tcu::toHex(refValue) << ", got " << tcu::toHex(resValue)
								   << TestLog::EndMessage;

				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid result value");
			}
		}
	}

	return STOP;
}